

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O2

uint64_t __thiscall cfd::core::Deserializer::ReadVariableInt(Deserializer *this)

{
  uint uVar1;
  pointer puVar2;
  uint64_t uVar3;
  uint32_t uVar4;
  
  CheckReadSize(this,1);
  puVar2 = (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  uVar1 = this->offset_;
  uVar3 = (uint64_t)puVar2[uVar1];
  if (uVar3 < 0xfd) {
    uVar4 = uVar1 + 1;
  }
  else if (uVar3 == 0xfe) {
    CheckReadSize(this,5);
    uVar3 = (uint64_t)*(uint *)(puVar2 + (ulong)uVar1 + 1);
    uVar4 = this->offset_ + 5;
  }
  else if (puVar2[uVar1] == 0xfd) {
    CheckReadSize(this,3);
    uVar3 = (uint64_t)*(ushort *)(puVar2 + (ulong)uVar1 + 1);
    uVar4 = this->offset_ + 3;
  }
  else {
    CheckReadSize(this,9);
    uVar3 = *(uint64_t *)(puVar2 + (ulong)uVar1 + 1);
    uVar4 = this->offset_ + 9;
  }
  this->offset_ = uVar4;
  return uVar3;
}

Assistant:

uint64_t Deserializer::ReadVariableInt() {
  CheckReadSize(1);
  const uint8_t* buf = buffer_.data() + offset_;
  uint64_t value = 0;
  if (*buf <= Serializer::kViMax8) {
    value = *buf;
    offset_ += 1;
  } else if (*buf == Serializer::kViTag16) {
    CheckReadSize(3);
    ++buf;
    uint16_t num;
    memcpy(&num, buf, sizeof(num));
    value = num;
    offset_ += 1 + sizeof(num);
  } else if (*buf == Serializer::kViTag32) {
    CheckReadSize(5);
    ++buf;
    uint32_t num;
    memcpy(&num, buf, sizeof(num));
    value = num;
    offset_ += 1 + sizeof(num);
  } else {
    CheckReadSize(9);
    ++buf;
    uint64_t num;
    memcpy(&num, buf, sizeof(num));
    value = num;
    offset_ += 1 + sizeof(num);
  }
  return value;
}